

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O2

void __thiscall CVmSrcfTable::~CVmSrcfTable(CVmSrcfTable *this)

{
  if (this->list_ != (CVmSrcfEntry **)0x0) {
    clear(this);
    free(this->list_);
    return;
  }
  return;
}

Assistant:

CVmSrcfTable::~CVmSrcfTable()
{
    /* delete the list if we allocated one */
    if (list_ != 0)
    {
        /* clear the table */
        clear();

        /* delete the list */
        t3free(list_);
    }
}